

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

string * httplib::detail::from_i_to_hex_abi_cxx11_(size_t n)

{
  ulong in_RSI;
  string *in_RDI;
  char *charset;
  string *ret;
  string local_40 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  char in_stack_ffffffffffffffdf;
  ulong local_10;
  
  std::__cxx11::string::string((string *)in_RDI);
  local_10 = in_RSI;
  do {
    std::operator+(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd0);
    std::__cxx11::string::operator=((string *)in_RDI,local_40);
    std::__cxx11::string::~string(local_40);
    local_10 = local_10 >> 4;
  } while (local_10 != 0);
  return in_RDI;
}

Assistant:

inline std::string from_i_to_hex(size_t n) {
            const char* charset = "0123456789abcdef";
            std::string ret;
            do {
                ret = charset[n & 15] + ret;
                n >>= 4;
            } while (n > 0);
            return ret;
        }